

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form1_BinaryErode(BinaryErodeForm1 BinaryErode)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  EVP_PKEY_CTX *src;
  size_type __n;
  Image output;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fillData;
  ImageTemplate<unsigned_char> local_88;
  Image local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  uVar2 = rand();
  __n = 0x14;
  if (0x14 < uVar2 % 200) {
    __n = (size_type)(uVar2 % 200);
  }
  local_60._vptr_ImageTemplate =
       (_func_int **)((ulong)local_60._vptr_ImageTemplate & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_38,__n,(value_type_conflict1 *)&local_60,(allocator_type *)&local_88);
  local_60._vptr_ImageTemplate = (_func_int **)CONCAT71(local_60._vptr_ImageTemplate._1_7_,0xff);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
              (&local_38,
               (iterator)
               local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish,(uchar *)&local_60);
  }
  else {
    *local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_finish = 0xff;
    local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  Unit_Test::randomImage(&local_60,&local_38);
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  local_88._data = (uchar *)0x0;
  local_88._type = local_60._type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_88,(EVP_PKEY_CTX *)&local_60,src);
  uVar2 = rand();
  uVar3 = rand();
  (*BinaryErode)(&local_88,uVar2 % 5 + (uint)(uVar2 % 5 == 0),uVar3 % 5 + (uint)(uVar3 % 5 == 0));
  if ((((local_60._height == local_88._height) && (local_60._width == local_88._width)) &&
      (local_60._alignment == local_88._alignment)) &&
     ((local_60._colorCount == local_88._colorCount && (local_60._rowSize == local_88._rowSize)))) {
    bVar1 = Unit_Test::verifyImage(&local_88,'\0');
  }
  else {
    bVar1 = false;
  }
  local_88._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_88);
  local_60._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_60);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool form1_BinaryErode(BinaryErodeForm1 BinaryErode)
    {
        std::vector< uint8_t > fillData( randomValue<uint32_t>(20, 200), 0u );
        fillData.push_back(255u);

        const PenguinV_Image::Image input = randomImage( fillData );
        PenguinV_Image::Image output = input;

        const uint32_t dilationX = randomValue<uint32_t>(1, 5);
        const uint32_t dilationY = randomValue<uint32_t>(1, 5);

        BinaryErode(output, dilationX, dilationY);

        return equalSize( input, output ) && verifyImage( output, 0u );
    }